

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::BasicCopyTexImage2DCase::createTexture(BasicCopyTexImage2DCase *this)

{
  ContextWrapper *this_00;
  int iVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  TextureFormat TVar7;
  Context *pCVar8;
  NotSupportedError *this_01;
  bool bVar9;
  int height;
  int width;
  deUint32 tex;
  int local_1bc;
  Random rnd;
  Vec4 local_1a8;
  Vec4 local_198;
  GradientShader shader;
  long lVar6;
  
  iVar1 = (*((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  bVar9 = false;
  if ((0 < *(int *)(lVar6 + 8)) && (bVar9 = false, 0 < *(int *)(lVar6 + 0xc))) {
    bVar9 = 0 < *(int *)(lVar6 + 0x10);
  }
  local_1bc = *(int *)(lVar6 + 0x14);
  TVar7 = mapGLUnsizedInternalFormat(*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4);
  tex = 0;
  dVar2 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar2 = (*pCVar8->_vptr_Context[0x75])(pCVar8,&shader);
  if ((TVar7.order == A || bVar9) &&
     ((RGBA < TVar7.order || (0xedU >> ((byte)TVar7.order & 0x1f) & 1) != 0) || 0 < local_1bc)) {
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_198.m_data[0] = 0.0;
    local_198.m_data[1] = 0.0;
    local_198.m_data[2] = 0.0;
    local_198.m_data[3] = 0.0;
    local_1a8.m_data[0] = 1.0;
    local_1a8.m_data[1] = 1.0;
    local_1a8.m_data[2] = 1.0;
    local_1a8.m_data[3] = 1.0;
    FboTestUtil::GradientShader::setGradient(&shader,pCVar8,dVar2,&local_198,&local_1a8);
    pCVar8 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_198.m_data[0] = -1.0;
    local_198.m_data[1] = -1.0;
    local_198.m_data._8_8_ = local_198.m_data._8_8_ & 0xffffffff00000000;
    local_1a8.m_data[0] = 1.0;
    local_1a8.m_data[1] = 1.0;
    local_1a8.m_data._8_8_ = local_1a8.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar8,dVar2,(Vec3 *)&local_198,(Vec3 *)&local_1a8);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
      iVar1 = 0;
      do {
        width = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar1 & 0x1f);
        if (width < 2) {
          width = 1;
        }
        height = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar1 & 0x1f);
        if (height < 2) {
          height = 1;
        }
        iVar3 = sglr::ContextWrapper::getWidth(this_00);
        dVar2 = deRandom_getUint32(&rnd.m_rnd);
        iVar4 = sglr::ContextWrapper::getHeight(this_00);
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        sglr::ContextWrapper::glCopyTexImage2D
                  (this_00,0xde1,iVar1,*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4,
                   dVar2 % ((iVar3 - width) + 1U),dVar5 % ((iVar4 - height) + 1U),width,height,0);
        iVar1 = iVar1 + 1;
      } while (iVar1 < (this->super_Texture2DSpecCase).m_numLevels);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x75f);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= mapGLUnsizedInternalFormat(m_internalFormat);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			int		x			= rnd.getInt(0, getWidth()	- levelW);
			int		y			= rnd.getInt(0, getHeight()	- levelH);

			glCopyTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, x, y, levelW, levelH, 0);
		}
	}